

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

void parse_chunk(LexState *ls)

{
  uint8_t *puVar1;
  long lVar2;
  BCLine line;
  FuncState *pFVar3;
  uint64_t uVar4;
  GCtab *pGVar5;
  bool bVar6;
  byte bVar7;
  LexToken LVar8;
  BCPos BVar9;
  BCPos pc;
  BCPos list;
  BCPos BVar10;
  int iVar11;
  int iVar12;
  BCReg BVar13;
  uint uVar14;
  VarInfo *pVVar15;
  GCstr *pGVar16;
  BCInsLine *pBVar17;
  cTValue *pcVar18;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  BCReg BVar19;
  uint uVar20;
  BCIns ins;
  char *__s2;
  FuncState *pFVar21;
  ExpDesc e;
  anon_union_8_3_2ce71dea_for_u local_68;
  ExpKind local_60;
  undefined1 local_5c;
  byte local_5b;
  uint local_50;
  BCLine local_4c;
  FuncScope local_48;
  ulong local_38;
  
  synlevel_begin(ls);
  bVar6 = false;
LAB_0011c706:
  if (bVar6) {
LAB_0011d2e1:
    ls->level = ls->level - 1;
    return;
  }
  iVar11 = ls->tok;
  if ((iVar11 - 0x104U < 0x1e) && ((0x20020007U >> (iVar11 - 0x104U & 0x1f) & 1) != 0))
  goto LAB_0011d2e1;
  if (0x14 < iVar11 - 0x102U) {
    if (iVar11 != 0x11d) goto switchD_0011c747_caseD_104;
    parse_label(ls);
    goto LAB_0011cf57;
  }
  line = ls->linenumber;
  switch(iVar11) {
  case 0x102:
    lj_lex_next(ls);
    parse_break(ls);
    goto LAB_0011cc8d;
  case 0x103:
    lj_lex_next(ls);
    parse_block(ls);
    lex_match(ls,0x106,0x103,line);
    break;
  default:
    goto switchD_0011c747_caseD_104;
  case 0x108:
    pFVar21 = ls->fs;
    local_48.nactvar = (uint8_t)pFVar21->nactvar;
    local_48.flags = '\x01';
    local_48.vstart = pFVar21->ls->vtop;
    local_48.prev = pFVar21->bl;
    pFVar21->bl = &local_48;
    lj_lex_next(ls);
    pGVar16 = lex_str(ls);
    iVar11 = ls->tok;
    if ((iVar11 == 0x2c) || (iVar11 == 0x10c)) {
      pFVar3 = ls->fs;
      uVar14 = pFVar3->pc;
      local_38 = (ulong)pFVar3->freereg;
      var_new(ls,0,(GCstr *)0x4);
      var_new(ls,1,(GCstr *)0x5);
      var_new(ls,2,(GCstr *)0x6);
      var_new(ls,3,pGVar16);
      iVar11 = 0x2000000;
      BVar13 = 4;
      while (iVar12 = lex_opt(ls,0x2c), iVar12 != 0) {
        pGVar16 = lex_str(ls);
        var_new(ls,BVar13,pGVar16);
        iVar11 = iVar11 + 0x1000000;
        BVar13 = BVar13 + 1;
      }
      lex_check(ls,0x10c);
      local_4c = ls->linenumber;
      BVar19 = expr_list(ls,&e);
      assign_adjust(ls,3,BVar19,&e);
      bcreg_bump(pFVar3,4);
      if (BVar13 < 6) {
        if (uVar14 < pFVar3->bclim) {
          uVar20 = pFVar3->bcbase[uVar14].ins;
          if ((char)uVar20 == '6') {
            pGVar5 = pFVar3->kt;
            pGVar16 = lj_str_new(ls->L,"pairs",5);
            pcVar18 = lj_tab_getstr(pGVar5,pGVar16);
            if (((pcVar18 == (cTValue *)0x0) || ((pcVar18->field_4).it != 0)) ||
               (uVar14 = (uint)CONCAT71((int7)((ulong)extraout_RDX >> 8),1),
               (pcVar18->field_4).i != uVar20 >> 0x10)) {
              pGVar5 = pFVar3->kt;
              pGVar16 = lj_str_new(ls->L,"next",4);
              pcVar18 = lj_tab_getstr(pGVar5,pGVar16);
              if (((pcVar18 == (cTValue *)0x0) || ((pcVar18->field_4).it != 0)) ||
                 (uVar14 = (uint)CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),1),
                 (pcVar18->field_4).i != uVar20 >> 0x10)) goto LAB_0011d12d;
            }
          }
          else {
            if ((uVar20 & 0xff) == 0x2d) {
              lVar2 = (ulong)(uVar20 >> 0x10) * 2 + 0x1ec;
            }
            else {
              if (((uVar20 & 0xff) != 0x12) || (pFVar3->nactvar <= uVar20 >> 0x10))
              goto LAB_0011d12d;
              lVar2 = (ulong)(uVar20 >> 0x10) * 2 + 0x5c;
            }
            uVar4 = ls->vstack[*(ushort *)((long)pFVar3->varmap + lVar2 + -0x5c)].name.gcptr64;
            iVar12 = *(int *)(uVar4 + 0x14);
            if (iVar12 == 4) {
              __s2 = "next";
            }
            else {
              if (iVar12 != 5) goto LAB_0011d12d;
              __s2 = "pairs";
            }
            iVar12 = strcmp((char *)(uVar4 + 0x18),__s2);
            uVar14 = (uint)CONCAT71((int7)((ulong)extraout_RDX_01 >> 8),iVar12 == 0);
          }
        }
        else {
LAB_0011d12d:
          uVar14 = 0;
        }
      }
      else {
        uVar14 = 0;
      }
      local_50 = uVar14;
      var_add(ls,3);
      lex_check(ls,0x103);
      iVar12 = (int)local_38 * 0x100;
      uVar20 = iVar12 + 0x300;
      BVar10 = bcemit_INS(pFVar3,((byte)~(byte)uVar14 & 1) * 0x10 + iVar12 + 0x300 | 0x7fff0048);
      local_5c = (undefined1)pFVar3->nactvar;
      local_5b = 0;
      local_60 = pFVar3->ls->vtop;
      local_68 = (anon_union_8_3_2ce71dea_for_u)pFVar3->bl;
      pFVar3->bl = (FuncScope *)&local_68;
      var_add(ls,BVar13 - 3);
      bcreg_reserve(pFVar3,BVar13 - 3);
      parse_block(ls);
      fscope_end(pFVar3);
      jmp_patchins(pFVar3,BVar10,pFVar3->pc);
      bcemit_INS(pFVar3,(local_50 & 1) + iVar11 + 0x45 | uVar20 | 0x30000);
      BVar9 = bcemit_INS(pFVar3,uVar20 | 0x7fff0052);
      pBVar17 = pFVar3->bcbase;
      pBVar17[BVar9 - 1].line = local_4c;
      pBVar17[BVar9].line = local_4c;
      jmp_patchins(pFVar3,BVar9,BVar10 + 1);
    }
    else {
      if (iVar11 != 0x3d) {
        err_syntax(ls,LJ_ERR_XFOR);
      }
      pFVar3 = ls->fs;
      BVar13 = pFVar3->freereg;
      var_new(ls,0,(GCstr *)0x1);
      var_new(ls,1,(GCstr *)0x2);
      var_new(ls,2,(GCstr *)0x3);
      var_new(ls,3,pGVar16);
      lex_check(ls,0x3d);
      expr_next(ls);
      lex_check(ls,0x2c);
      expr_next(ls);
      iVar11 = lex_opt(ls,0x2c);
      if (iVar11 == 0) {
        bcemit_INS(pFVar3,pFVar3->freereg << 8 | 0x10029);
        bcreg_reserve(pFVar3,1);
      }
      else {
        expr_next(ls);
      }
      var_add(ls,3);
      lex_check(ls,0x103);
      uVar14 = BVar13 << 8;
      BVar10 = bcemit_INS(pFVar3,uVar14 | 0x7fff004d);
      e.t._0_1_ = (undefined1)pFVar3->nactvar;
      e.t._1_1_ = 0;
      e.k = pFVar3->ls->vtop;
      e.u = (anon_union_8_3_2ce71dea_for_u)pFVar3->bl;
      pFVar3->bl = (FuncScope *)&e;
      var_add(ls,1);
      bcreg_reserve(pFVar3,1);
      parse_block(ls);
      fscope_end(pFVar3);
      BVar9 = bcemit_INS(pFVar3,uVar14 | 0x7fff004f);
      pFVar3->bcbase[BVar9].line = line;
      jmp_patchins(pFVar3,BVar9,BVar10 + 1);
      jmp_patchins(pFVar3,BVar10,pFVar3->pc);
    }
    lex_match(ls,0x106,0x108,line);
    goto LAB_0011d265;
  case 0x109:
    lj_lex_next(ls);
    pFVar21 = ls->fs;
    pGVar16 = lex_str(ls);
    var_lookup_(pFVar21,pGVar16,&e,1);
    while (iVar11 = ls->tok, iVar11 == 0x2e) {
      expr_field(ls,&e);
    }
    if (iVar11 == 0x3a) {
      expr_field(ls,&e);
    }
    parse_body(ls,(ExpDesc *)&local_68.s,(uint)(iVar11 == 0x3a),line);
    pFVar21 = ls->fs;
    bcemit_store(pFVar21,&e,(ExpDesc *)&local_68.s);
    pFVar21->bcbase[pFVar21->pc - 1].line = line;
    bVar6 = false;
    goto LAB_0011d270;
  case 0x10a:
    LVar8 = lj_lex_lookahead(ls);
    if (LVar8 == 0x11f) {
      lj_lex_next(ls);
      pFVar21 = ls->fs;
      pGVar16 = lex_str(ls);
      pVVar15 = gola_findlabel(ls,pGVar16);
      if (pVVar15 != (VarInfo *)0x0) {
        bcemit_INS(pFVar21,(uint)pVVar15->slot << 8 | 0x7fff0055);
      }
      puVar1 = &pFVar21->bl->flags;
      *puVar1 = *puVar1 | 4;
      BVar10 = bcemit_jmp(pFVar21);
      gola_new(ls,pGVar16,'\x02',BVar10);
      goto LAB_0011d26a;
    }
    goto switchD_0011c747_caseD_104;
  case 0x10b:
    pFVar21 = ls->fs;
    e.u.s.info = 0xffffffff;
    while( true ) {
      lj_lex_next(ls);
      BVar10 = expr_cond(ls);
      lex_check(ls,0x113);
      parse_block(ls);
      if (ls->tok != 0x105) break;
      BVar9 = bcemit_jmp(pFVar21);
      jmp_append(pFVar21,(BCPos *)&e,BVar9);
      jmp_tohere(pFVar21,BVar10);
    }
    if (ls->tok == 0x104) {
      BVar9 = bcemit_jmp(pFVar21);
      jmp_append(pFVar21,(BCPos *)&e,BVar9);
      jmp_tohere(pFVar21,BVar10);
      lj_lex_next(ls);
      parse_block(ls);
    }
    else {
      jmp_append(pFVar21,(BCPos *)&e,BVar10);
    }
    jmp_tohere(pFVar21,e.u.s.info);
    lex_match(ls,0x106,0x10b,line);
    goto LAB_0011d26a;
  case 0x10d:
    lj_lex_next(ls);
    iVar11 = lex_opt(ls,0x109);
    if (iVar11 == 0) {
      BVar13 = 0;
      do {
        BVar19 = BVar13 + 1;
        pGVar16 = lex_str(ls);
        var_new(ls,BVar13,pGVar16);
        iVar11 = lex_opt(ls,0x2c);
        BVar13 = BVar19;
      } while (iVar11 != 0);
      iVar11 = lex_opt(ls,0x3d);
      if (iVar11 == 0) {
        e.k = VVOID;
        BVar13 = 0;
      }
      else {
        BVar13 = expr_list(ls,&e);
      }
      assign_adjust(ls,BVar19,BVar13,&e);
      var_add(ls,BVar19);
    }
    else {
      pFVar21 = ls->fs;
      pGVar16 = lex_str(ls);
      var_new(ls,0,pGVar16);
      BVar13 = pFVar21->freereg;
      bcreg_reserve(pFVar21,1);
      var_add(ls,1);
      parse_body(ls,&e,0,ls->linenumber);
      if ((e.k == VNONRELOC) && (pFVar21->nactvar <= e.u.s.info)) {
        pFVar21->freereg = pFVar21->freereg - 1;
      }
      expr_toreg(pFVar21,&e,BVar13);
      ls->vstack[pFVar21->varmap[pFVar21->nactvar - 1]].startpc = pFVar21->pc;
    }
    break;
  case 0x111:
    pFVar21 = ls->fs;
    BVar10 = pFVar21->pc;
    pFVar21->lasttarget = BVar10;
    e.t._0_1_ = (undefined1)pFVar21->nactvar;
    e.t._1_1_ = 1;
    e.k = pFVar21->ls->vtop;
    e.u = (anon_union_8_3_2ce71dea_for_u)pFVar21->bl;
    local_5b = 0;
    pFVar21->bl = (FuncScope *)&local_68;
    local_68.sval = (GCstr *)&e;
    local_60 = e.k;
    local_5c = (undefined1)e.t;
    lj_lex_next(ls);
    bcemit_INS(pFVar21,pFVar21->nactvar << 8 | 0x55);
    parse_chunk(ls);
    lex_match(ls,0x115,0x111,line);
    BVar9 = expr_cond(ls);
    if ((local_5b & 8) == 0) {
      fscope_end(pFVar21);
    }
    else {
      parse_break(ls);
      jmp_tohere(pFVar21,BVar9);
      fscope_end(pFVar21);
      BVar9 = bcemit_jmp(pFVar21);
    }
    jmp_patch(pFVar21,BVar9,BVar10);
    jmp_patchins(pFVar21,BVar10,pFVar21->pc);
LAB_0011d265:
    fscope_end(pFVar21);
LAB_0011d26a:
    bVar6 = false;
    goto LAB_0011d270;
  case 0x112:
    pFVar21 = ls->fs;
    lj_lex_next(ls);
    bVar7 = pFVar21->flags | 0x20;
    pFVar21->flags = bVar7;
    ins = 0x1004b;
    uVar14 = ls->tok - 0x104;
    if (((0x1d < uVar14) || ((0x20020007U >> (uVar14 & 0x1f) & 1) == 0)) && (ls->tok != 0x3b)) {
      BVar13 = expr_list(ls,&e);
      if (BVar13 == 1) {
        if (e.k == VCALL) {
          pBVar17 = pFVar21->bcbase;
          if ((char)pBVar17[(ulong)e.u.sval & 0xffffffff].ins == 'G') goto LAB_0011d057;
          pFVar21->pc = pFVar21->pc - 1;
          uVar14 = (pBVar17[(ulong)e.u.sval & 0xffffffff].ins & 0xff) + 2;
          uVar20 = pBVar17[(ulong)e.u.sval & 0xffffffff].ins & 0xffff00;
LAB_0011d2bc:
          ins = uVar20 | uVar14;
        }
        else {
          BVar13 = expr_toanyreg(pFVar21,&e);
          ins = BVar13 << 8 | 0x2004c;
        }
      }
      else {
        if (e.k != VCALL) {
          expr_tonextreg(pFVar21,&e);
          uVar14 = pFVar21->nactvar << 8;
          uVar20 = BVar13 * 0x10000 + 0x1004a;
          goto LAB_0011d2bc;
        }
        pBVar17 = pFVar21->bcbase;
LAB_0011d057:
        *(undefined1 *)((long)&pBVar17[(ulong)e.u.sval & 0xffffffff].ins + 3) = 0;
        ins = (e.u.s.aux - pFVar21->nactvar) * 0x10000 | pFVar21->nactvar << 8 | 0x49;
      }
      bVar7 = pFVar21->flags;
    }
    if ((bVar7 & 1) != 0) {
      bcemit_INS(pFVar21,0x80000032);
    }
    bcemit_INS(pFVar21,ins);
LAB_0011cc8d:
    bVar6 = true;
    goto LAB_0011d270;
  case 0x116:
    pFVar21 = ls->fs;
    lj_lex_next(ls);
    BVar10 = pFVar21->pc;
    pFVar21->lasttarget = BVar10;
    BVar9 = expr_cond(ls);
    e.t._0_1_ = (undefined1)pFVar21->nactvar;
    e.t._1_1_ = 1;
    e.k = pFVar21->ls->vtop;
    e.u = (anon_union_8_3_2ce71dea_for_u)pFVar21->bl;
    pFVar21->bl = (FuncScope *)&e;
    lex_check(ls,0x103);
    pc = bcemit_INS(pFVar21,pFVar21->nactvar << 8 | 0x55);
    parse_block(ls);
    list = bcemit_jmp(pFVar21);
    jmp_patch(pFVar21,list,BVar10);
    lex_match(ls,0x106,0x116,line);
    fscope_end(pFVar21);
    jmp_tohere(pFVar21,BVar9);
    jmp_patchins(pFVar21,pc,pFVar21->pc);
  }
LAB_0011cf57:
  bVar6 = false;
LAB_0011d270:
  lex_opt(ls,0x3b);
  ls->fs->freereg = ls->fs->nactvar;
  goto LAB_0011c706;
switchD_0011c747_caseD_104:
  pFVar21 = ls->fs;
  expr_primary(ls,&e);
  if (e.k == VCALL) {
    *(undefined1 *)((long)&pFVar21->bcbase[(ulong)e.u.sval & 0xffffffff].ins + 3) = 1;
  }
  else {
    parse_assignment(ls,(LHSVarList *)&e,1);
  }
  goto LAB_0011cf57;
}

Assistant:

static void parse_chunk(LexState *ls)
{
  int islast = 0;
  synlevel_begin(ls);
  while (!islast && !parse_isend(ls->tok)) {
    islast = parse_stmt(ls);
    lex_opt(ls, ';');
    lj_assertLS(ls->fs->framesize >= ls->fs->freereg &&
		ls->fs->freereg >= ls->fs->nactvar,
		"bad regalloc");
    ls->fs->freereg = ls->fs->nactvar;  /* Free registers after each stmt. */
  }
  synlevel_end(ls);
}